

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O2

int ptls_send_alert(ptls_t *tls,ptls_buffer_t *sendbuf,uint8_t level,uint8_t description)

{
  size_t rec_start;
  size_t sVar1;
  int iVar2;
  long lVar3;
  undefined1 local_35 [2];
  undefined1 local_33 [3];
  
  rec_start = sendbuf->off;
  iVar2 = ptls_buffer__do_pushv(sendbuf,local_33,3);
  if (iVar2 == 0) {
    iVar2 = ptls_buffer__do_pushv(sendbuf,"",2);
    if (iVar2 == 0) {
      sVar1 = sendbuf->off;
      iVar2 = ptls_buffer__do_pushv(sendbuf,local_35,2);
      if (iVar2 == 0) {
        lVar3 = sendbuf->off - sVar1;
        sendbuf->base[sVar1 - 2] = (uint8_t)((ulong)lVar3 >> 8);
        sendbuf->base[sVar1 - 1] = (uint8_t)lVar3;
        iVar2 = 0;
        if (((tls->traffic_protection).enc.aead != (ptls_aead_context_t *)0x0) &&
           (PTLS_STATE_CLIENT_EXPECT_FINISHED < tls->state)) {
          iVar2 = buffer_encrypt_record(sendbuf,rec_start,&(tls->traffic_protection).enc);
          return iVar2;
        }
      }
    }
  }
  return iVar2;
}

Assistant:

int ptls_send_alert(ptls_t *tls, ptls_buffer_t *sendbuf, uint8_t level, uint8_t description)
{
    size_t rec_start = sendbuf->off;
    int ret = 0;

    buffer_push_record(sendbuf, PTLS_CONTENT_TYPE_ALERT, { ptls_buffer_push(sendbuf, level, description); });
    /* encrypt the alert if we have the encryption keys, unless when it is the early data key */
    if (tls->traffic_protection.enc.aead != NULL && !(tls->state <= PTLS_STATE_CLIENT_EXPECT_FINISHED)) {
        if ((ret = buffer_encrypt_record(sendbuf, rec_start, &tls->traffic_protection.enc)) != 0)
            goto Exit;
    }

Exit:
    return ret;
}